

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O3

bool __thiscall
cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator==(iterator *this,iterator other)

{
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar1;
  
  pcVar1 = this->Tree;
  if (pcVar1 == (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0) {
    __assert_fail("this->Tree",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLinkedTree.h"
                  ,0x68,
                  "bool cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator==(iterator) const [T = cmStateDetail::SnapshotDataType]"
                 );
  }
  if ((long)(pcVar1->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(pcVar1->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start >> 3 ==
      ((long)(pcVar1->Data).
             super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(pcVar1->Data).
             super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
             ._M_impl.super__Vector_impl_data._M_start >> 6) * -0x5555555555555555) {
    if (pcVar1 == other.Tree) {
      return this->Position == other.Position;
    }
    __assert_fail("this->Tree == other.Tree",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLinkedTree.h"
                  ,0x6a,
                  "bool cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator==(iterator) const [T = cmStateDetail::SnapshotDataType]"
                 );
  }
  __assert_fail("this->Tree->UpPositions.size() == this->Tree->Data.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLinkedTree.h"
                ,0x69,
                "bool cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator==(iterator) const [T = cmStateDetail::SnapshotDataType]"
               );
}

Assistant:

bool operator==(iterator other) const
    {
      assert(this->Tree);
      assert(this->Tree->UpPositions.size() == this->Tree->Data.size());
      assert(this->Tree == other.Tree);
      return this->Position == other.Position;
    }